

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O3

bool __thiscall
ImPlot::LineStripRenderer<ImPlot::GetterXsYs<int>,_ImPlot::TransformerLinLog>::operator()
          (LineStripRenderer<ImPlot::GetterXsYs<int>,_ImPlot::TransformerLinLog> *this,
          ImDrawList *DrawList,ImRect *cull_rect,ImVec2 *uv,int prim)

{
  double dVar1;
  ImVec2 IVar2;
  ImVec2 IVar3;
  int iVar4;
  ImU32 IVar5;
  uint uVar6;
  GetterXsYs<int> *pGVar7;
  TransformerLinLog *pTVar8;
  ImPlotPlot *pIVar9;
  ImDrawVert *pIVar10;
  ImDrawVert *pIVar11;
  ImDrawIdx *pIVar12;
  double dVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [12];
  ImPlotContext *pIVar16;
  int iVar17;
  long lVar18;
  ImDrawIdx IVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  
  pIVar16 = GImPlot;
  pGVar7 = this->Getter;
  pTVar8 = this->Transformer;
  iVar17 = pGVar7->Count;
  lVar18 = (long)(((pGVar7->Offset + prim + 1) % iVar17 + iVar17) % iVar17) * (long)pGVar7->Stride;
  iVar17 = *(int *)((long)pGVar7->Xs + lVar18);
  dVar13 = log10((double)*(int *)((long)pGVar7->Ys + lVar18) /
                 GImPlot->CurrentPlot->YAxis[pTVar8->YAxis].Range.Min);
  iVar4 = pTVar8->YAxis;
  pIVar9 = pIVar16->CurrentPlot;
  dVar1 = pIVar9->YAxis[iVar4].Range.Min;
  IVar2 = pIVar16->PixelRange[iVar4].Min;
  fVar20 = (float)(pIVar16->Mx * ((double)iVar17 - (pIVar9->XAxis).Range.Min) + (double)IVar2.x);
  fVar21 = (float)(pIVar16->My[iVar4] *
                   (((double)(float)(dVar13 / pIVar16->LogDenY[iVar4]) *
                     (pIVar9->YAxis[iVar4].Range.Max - dVar1) + dVar1) - dVar1) + (double)IVar2.y);
  fVar22 = (this->P1).x;
  fVar23 = (this->P1).y;
  auVar27._0_4_ = ~-(uint)(fVar20 <= fVar22) & (uint)fVar20;
  auVar27._4_4_ = ~-(uint)(fVar21 <= fVar23) & (uint)fVar21;
  auVar27._8_4_ = ~-(uint)(fVar22 < fVar20) & (uint)fVar20;
  auVar27._12_4_ = ~-(uint)(fVar23 < fVar21) & (uint)fVar21;
  auVar14._4_4_ = (uint)fVar23 & -(uint)(fVar21 <= fVar23);
  auVar14._0_4_ = (uint)fVar22 & -(uint)(fVar20 <= fVar22);
  auVar14._8_4_ = (uint)fVar22 & -(uint)(fVar22 < fVar20);
  auVar14._12_4_ = (uint)fVar23 & -(uint)(fVar23 < fVar21);
  auVar27 = auVar27 | auVar14;
  fVar24 = (cull_rect->Min).y;
  auVar15._4_8_ = auVar27._8_8_;
  auVar15._0_4_ = -(uint)(auVar27._4_4_ < fVar24);
  auVar28._0_8_ = auVar15._0_8_ << 0x20;
  auVar28._8_4_ = -(uint)(auVar27._8_4_ < (cull_rect->Max).x);
  auVar28._12_4_ = -(uint)(auVar27._12_4_ < (cull_rect->Max).y);
  auVar29._4_4_ = -(uint)(fVar24 < auVar27._4_4_);
  auVar29._0_4_ = -(uint)((cull_rect->Min).x < auVar27._0_4_);
  auVar29._8_8_ = auVar28._8_8_;
  iVar17 = movmskps((int)pIVar9,auVar29);
  if (iVar17 == 0xf) {
    IVar5 = this->Col;
    IVar2 = *uv;
    fVar24 = fVar20 - fVar22;
    fVar25 = fVar21 - fVar23;
    fVar26 = fVar24 * fVar24 + fVar25 * fVar25;
    if (0.0 < fVar26) {
      fVar26 = 1.0 / SQRT(fVar26);
      fVar24 = fVar24 * fVar26;
      fVar25 = fVar25 * fVar26;
    }
    fVar26 = this->Weight * 0.5;
    pIVar10 = DrawList->_VtxWritePtr;
    pIVar10->uv = IVar2;
    pIVar11 = DrawList->_VtxWritePtr;
    pIVar11->col = IVar5;
    fVar24 = fVar26 * fVar24;
    fVar26 = fVar26 * fVar25;
    (pIVar10->pos).x = fVar22 + fVar26;
    (pIVar10->pos).y = fVar23 - fVar24;
    pIVar11[1].pos.x = fVar26 + fVar20;
    pIVar11[1].pos.y = fVar21 - fVar24;
    pIVar11[1].uv = IVar2;
    pIVar10 = DrawList->_VtxWritePtr;
    pIVar10[1].col = IVar5;
    pIVar10[2].pos.x = fVar20 - fVar26;
    pIVar10[2].pos.y = fVar24 + fVar21;
    pIVar10[2].uv = IVar2;
    pIVar10 = DrawList->_VtxWritePtr;
    pIVar10[2].col = IVar5;
    IVar3 = this->P1;
    pIVar10[3].pos.x = IVar3.x - fVar26;
    pIVar10[3].pos.y = IVar3.y + fVar24;
    pIVar10[3].uv.x = IVar2.x;
    pIVar10[3].uv.y = IVar2.y;
    pIVar10 = DrawList->_VtxWritePtr;
    pIVar10[3].col = IVar5;
    DrawList->_VtxWritePtr = pIVar10 + 4;
    uVar6 = DrawList->_VtxCurrentIdx;
    pIVar12 = DrawList->_IdxWritePtr;
    IVar19 = (ImDrawIdx)uVar6;
    *pIVar12 = IVar19;
    pIVar12[1] = IVar19 + 1;
    pIVar12[2] = IVar19 + 2;
    pIVar12[3] = IVar19;
    pIVar12[4] = IVar19 + 2;
    pIVar12[5] = IVar19 + 3;
    DrawList->_IdxWritePtr = pIVar12 + 6;
    DrawList->_VtxCurrentIdx = uVar6 + 4;
  }
  IVar2.y = fVar21;
  IVar2.x = fVar20;
  this->P1 = IVar2;
  return (char)iVar17 == '\x0f';
}

Assistant:

inline bool operator()(ImDrawList& DrawList, const ImRect& cull_rect, const ImVec2& uv, int prim) const {
        ImVec2 P2 = Transformer(Getter(prim + 1));
        if (!cull_rect.Overlaps(ImRect(ImMin(P1, P2), ImMax(P1, P2)))) {
            P1 = P2;
            return false;
        }
        AddLine(P1,P2,Weight,Col,DrawList,uv);
        P1 = P2;
        return true;
    }